

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

size_t psa_get_hash_block_size(psa_algorithm_t alg)

{
  size_t sStack_10;
  psa_algorithm_t alg_local;
  
  switch(alg) {
  case 0x1000001:
    sStack_10 = 0x10;
    break;
  case 0x1000002:
    sStack_10 = 0x40;
    break;
  case 0x1000003:
    sStack_10 = 0x40;
    break;
  case 0x1000004:
    sStack_10 = 0x40;
    break;
  case 0x1000005:
    sStack_10 = 0x40;
    break;
  default:
    sStack_10 = 0;
    break;
  case 0x1000008:
    sStack_10 = 0x40;
    break;
  case 0x1000009:
    sStack_10 = 0x40;
    break;
  case 0x100000a:
    sStack_10 = 0x80;
    break;
  case 0x100000b:
    sStack_10 = 0x80;
  }
  return sStack_10;
}

Assistant:

static size_t psa_get_hash_block_size( psa_algorithm_t alg )
{
    switch( alg )
    {
        case PSA_ALG_MD2:
            return( 16 );
        case PSA_ALG_MD4:
            return( 64 );
        case PSA_ALG_MD5:
            return( 64 );
        case PSA_ALG_RIPEMD160:
            return( 64 );
        case PSA_ALG_SHA_1:
            return( 64 );
        case PSA_ALG_SHA_224:
            return( 64 );
        case PSA_ALG_SHA_256:
            return( 64 );
        case PSA_ALG_SHA_384:
            return( 128 );
        case PSA_ALG_SHA_512:
            return( 128 );
        default:
            return( 0 );
    }
}